

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O2

Vec_Int_t * Acec_TreeFindPoints(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Bit_t *vIgnore)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *vMap;
  int iAdd;
  int i;
  
  vMap = Vec_IntStartFull(p->nObjs * 2);
  iAdd = 0;
  i = 4;
  do {
    if (vAdds->nSize <= i + -4) {
      return vMap;
    }
    iVar1 = i;
    if (vIgnore == (Vec_Bit_t *)0x0) {
LAB_00546f08:
      iVar2 = Vec_IntEntry(vAdds,i + -4);
      Acec_TreeAddInOutPoint(vMap,iVar2,iAdd,0);
      iVar2 = Vec_IntEntry(vAdds,i + -3);
      Acec_TreeAddInOutPoint(vMap,iVar2,iAdd,0);
      iVar2 = Vec_IntEntry(vAdds,i + -2);
      Acec_TreeAddInOutPoint(vMap,iVar2,iAdd,0);
      iVar2 = Vec_IntEntry(vAdds,i + -1);
      Acec_TreeAddInOutPoint(vMap,iVar2,iAdd,1);
      iVar1 = Vec_IntEntry(vAdds,iVar1);
      Acec_TreeAddInOutPoint(vMap,iVar1,iAdd,1);
    }
    else {
      iVar1 = Vec_IntEntry(vAdds,i + -1);
      iVar1 = Vec_BitEntry(vIgnore,iVar1);
      if (iVar1 == 0) {
        iVar1 = Vec_IntEntry(vAdds,i);
        iVar1 = Vec_BitEntry(vIgnore,iVar1);
        if (iVar1 == 0) {
          iVar1 = iAdd * 6 + 4;
          goto LAB_00546f08;
        }
      }
    }
    iAdd = iAdd + 1;
    i = i + 6;
  } while( true );
}

Assistant:

Vec_Int_t * Acec_TreeFindPoints( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Bit_t * vIgnore )
{
    Vec_Int_t * vMap = Vec_IntStartFull( 2*Gia_ManObjNum(p) );
    int i;
    for ( i = 0; 6*i < Vec_IntSize(vAdds); i++ )
    {
        if ( vIgnore && (Vec_BitEntry(vIgnore, Vec_IntEntry(vAdds, 6*i+3)) || Vec_BitEntry(vIgnore, Vec_IntEntry(vAdds, 6*i+4))) )
            continue;
        Acec_TreeAddInOutPoint( vMap, Vec_IntEntry(vAdds, 6*i+0), i, 0 );
        Acec_TreeAddInOutPoint( vMap, Vec_IntEntry(vAdds, 6*i+1), i, 0 );
        Acec_TreeAddInOutPoint( vMap, Vec_IntEntry(vAdds, 6*i+2), i, 0 );
        Acec_TreeAddInOutPoint( vMap, Vec_IntEntry(vAdds, 6*i+3), i, 1 );
        Acec_TreeAddInOutPoint( vMap, Vec_IntEntry(vAdds, 6*i+4), i, 1 );
    }
    return vMap;
}